

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O1

JSON __thiscall JSON::makeString(JSON *this,string *utf8)

{
  pointer pcVar1;
  _Head_base<0UL,_JSON::JSON_value_*,_false> _Var2;
  Members *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  JSON JVar3;
  
  _Var2._M_head_impl = (JSON_value *)operator_new(0x30);
  (_Var2._M_head_impl)->type_code = vt_string;
  (_Var2._M_head_impl)->_vptr_JSON_value = (_func_int **)&PTR__JSON_string_002ede20;
  _Var2._M_head_impl[1]._vptr_JSON_value = (_func_int **)(_Var2._M_head_impl + 2);
  pcVar1 = (utf8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(_Var2._M_head_impl + 1),pcVar1,pcVar1 + utf8->_M_string_length);
  __p = (Members *)operator_new(0x18);
  (__p->value)._M_t.super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>.
  _M_t.super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
  super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl = _Var2._M_head_impl;
  __p->start = 0;
  __p->end = 0;
  (this->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<JSON::Members*>
            (&(this->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             __p);
  JVar3.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  JVar3.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (JSON)JVar3.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
JSON::makeString(std::string const& utf8)
{
    return {std::make_unique<JSON_string>(utf8)};
}